

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifCut.c
# Opt level: O2

float If_CutAreaRef(If_Man_t *p,If_Cut_t *pCut)

{
  int iVar1;
  If_Obj_t *pIVar2;
  ulong uVar3;
  float fVar4;
  float local_1c;
  
  local_1c = If_CutLutArea(p,pCut);
  uVar3 = 0;
  while( true ) {
    if ((byte)pCut->field_0x1f <= uVar3) {
      return local_1c;
    }
    pIVar2 = If_ManObj(p,(int)(&pCut[1].Area)[uVar3]);
    if (pIVar2 == (If_Obj_t *)0x0) break;
    iVar1 = pIVar2->nRefs;
    if (iVar1 < 0) {
      __assert_fail("pLeaf->nRefs >= 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifCut.c"
                    ,0x42b,"float If_CutAreaRef(If_Man_t *, If_Cut_t *)");
    }
    pIVar2->nRefs = iVar1 + 1;
    if ((iVar1 == 0) &&
       (((undefined1  [112])*pIVar2 & (undefined1  [112])0xf) == (undefined1  [112])0x4)) {
      fVar4 = If_CutAreaRef(p,&pIVar2->CutBest);
      local_1c = local_1c + fVar4;
    }
    uVar3 = uVar3 + 1;
  }
  return local_1c;
}

Assistant:

float If_CutAreaRef( If_Man_t * p, If_Cut_t * pCut )
{
    If_Obj_t * pLeaf;
    float Area;
    int i;
    Area = If_CutLutArea(p, pCut);
    If_CutForEachLeaf( p, pCut, pLeaf, i )
    {
        assert( pLeaf->nRefs >= 0 );
        if ( pLeaf->nRefs++ > 0 || !If_ObjIsAnd(pLeaf) )
            continue;
        Area += If_CutAreaRef( p, If_ObjCutBest(pLeaf) );
    }
    return Area;
}